

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

int __thiscall
slang::
SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
::copy(SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
       *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  size_type sVar2;
  pointer psVar3;
  undefined8 uVar4;
  byte *pbVar5;
  size_t size;
  long lVar6;
  bool bVar7;
  
  if (this->len == 0) {
    return 0;
  }
  size = this->len * 0x10;
  pbVar5 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  if (*(byte **)(dst + 8) < pbVar5 + size) {
    pbVar5 = BumpAllocator::allocateSlow((BumpAllocator *)dst,size,8);
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar5 + size;
  }
  sVar2 = this->len;
  if (sVar2 != 0) {
    psVar3 = this->data_;
    lVar6 = 0;
    do {
      puVar1 = (undefined8 *)((long)&psVar3->_M_ptr + lVar6);
      uVar4 = puVar1[1];
      *(undefined8 *)(pbVar5 + lVar6) = *puVar1;
      *(undefined8 *)(pbVar5 + lVar6 + 8) = uVar4;
      bVar7 = sVar2 * 0x10 + -0x10 == lVar6;
      if (bVar7) break;
      lVar6 = lVar6 + 0x10;
    } while (!bVar7);
  }
  return (int)pbVar5;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }